

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

bool __thiscall cs::event_type::touch(event_type *this,void *arg)

{
  function<bool_(void_*)> *pfVar1;
  function<bool_(void_*)> *pfVar2;
  bool bVar3;
  function<bool_(void_*)> *listener;
  function<bool_(void_*)> *pfVar4;
  
  pfVar1 = (this->m_listener).m_start;
  pfVar2 = (this->m_listener).m_current;
  do {
    pfVar4 = pfVar2;
    if (pfVar4 == pfVar1) break;
    bVar3 = std::function<bool_(void_*)>::operator()(pfVar4 + -1,arg);
    pfVar2 = pfVar4 + -1;
  } while (!bVar3);
  return pfVar4 != pfVar1;
}

Assistant:

bool touch(void *arg)
		{
			for (auto &listener: m_listener)
				if (listener(arg))
					return true;
			return false;
		}